

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O3

QAction * __thiscall QUndoStack::createUndoAction(QUndoStack *this,QObject *parent,QString *prefix)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  long lVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  bool b;
  QAction *this_00;
  long lVar10;
  undefined4 *puVar11;
  long in_FS_OFFSET;
  QObject local_c0 [8];
  QObject local_b8 [8];
  code *local_b0;
  ImplFn local_a8;
  QObject local_a0 [8];
  QString local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAction *)operator_new(0x10);
  QAction::QAction(this_00,parent);
  if (*(long *)(*(long *)&this->field_0x8 + 0xa0) == 0) {
    b = 0 < *(int *)(*(long *)&this->field_0x8 + 0xa8);
  }
  else {
    b = false;
  }
  QAction::setEnabled(this_00,b);
  local_58.d.d = (prefix->d).d;
  local_58.d.ptr = (prefix->d).ptr;
  local_58.d.size = (prefix->d).size;
  lVar10 = local_58.d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    lVar10 = (prefix->d).size;
  }
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  if (lVar10 == 0) {
    QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x6c603e);
    pcVar2 = local_58.d.ptr;
    pDVar7 = local_58.d.d;
    qVar6 = local_98.d.size;
    pDVar5 = local_98.d.d;
    local_98.d.d = local_58.d.d;
    local_58.d.d = pDVar5;
    local_58.d.ptr = local_98.d.ptr;
    local_98.d.ptr = pcVar2;
    local_98.d.size = local_58.d.size;
    local_58.d.size = qVar6;
    if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
      }
    }
    QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x6c6046);
    pcVar2 = local_78.d.ptr;
    pDVar7 = local_78.d.d;
    qVar6 = local_98.d.size;
    pDVar5 = local_98.d.d;
    pQVar1 = &(local_78.d.d)->super_QArrayData;
    lVar3 = local_78.d.size;
    pQVar4 = &(local_98.d.d)->super_QArrayData;
    local_78.d.ptr = local_98.d.ptr;
    local_98.d.d = local_78.d.d;
    local_78.d.d = pDVar5;
    lVar10 = local_98.d.size;
    local_98.d.ptr = pcVar2;
    local_98.d.size = local_78.d.size;
    local_78.d.size = qVar6;
    if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
      }
    }
  }
  undoText(&local_98,this);
  QUndoStackPrivate::setPrefixedText(this_00,&local_58,&local_78,&local_98);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_b0 = QAction::setEnabled;
  local_a8 = (ImplFn)0x0;
  local_98.d.d = (Data *)canUndoChanged;
  local_98.d.ptr = (char16_t *)0x0;
  puVar11 = (undefined4 *)operator_new(0x20);
  *puVar11 = 1;
  *(code **)(puVar11 + 2) =
       QtPrivate::QCallableObject<void_(QAction::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar11 + 4) = QAction::setEnabled;
  *(undefined8 *)(puVar11 + 6) = 0;
  QObject::connectImpl
            (local_a0,(void **)this,(QObject *)&local_98,(void **)this_00,
             (QSlotObjectBase *)&local_b0,(ConnectionType)puVar11,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  qVar9 = local_58.d.size;
  pcVar8 = local_58.d.ptr;
  pDVar7 = local_58.d.d;
  qVar6 = local_78.d.size;
  pcVar2 = local_78.d.ptr;
  pDVar5 = local_78.d.d;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d.d = (Data *)undoTextChanged;
  local_98.d.ptr = (char16_t *)0x0;
  puVar11 = (undefined4 *)operator_new(0x48);
  *puVar11 = 1;
  *(code **)(puVar11 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/util/qundostack.cpp:1051:57),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(QAction **)(puVar11 + 4) = this_00;
  *(Data **)(puVar11 + 6) = pDVar7;
  *(char16_t **)(puVar11 + 8) = pcVar8;
  *(qsizetype *)(puVar11 + 10) = qVar9;
  *(Data **)(puVar11 + 0xc) = pDVar5;
  *(char16_t **)(puVar11 + 0xe) = pcVar2;
  *(qsizetype *)(puVar11 + 0x10) = qVar6;
  QObject::connectImpl
            (local_b8,(void **)this,(QObject *)&local_98,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar11,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  local_b0 = undo;
  local_a8 = (ImplFn)0x0;
  local_98.d.d = (Data *)QAction::triggered;
  local_98.d.ptr = (char16_t *)0x0;
  puVar11 = (undefined4 *)operator_new(0x20);
  *puVar11 = 1;
  *(code **)(puVar11 + 2) =
       QtPrivate::QCallableObject<void_(QUndoStack::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar11 + 4) = undo;
  *(undefined8 *)(puVar11 + 6) = 0;
  QObject::connectImpl
            (local_c0,(void **)this_00,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_b0,(ConnectionType)puVar11,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QUndoStack::createUndoAction(QObject *parent, const QString &prefix) const
{
    QAction *action = new QAction(parent);
    action->setEnabled(canUndo());

    QString effectivePrefix = prefix;
    QString defaultText;
    if (prefix.isEmpty()) {
        effectivePrefix = tr("Undo %1");
        defaultText = tr("Undo", "Default text for undo action");
    }

    QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, undoText());

    connect(this, &QUndoStack::canUndoChanged, action, &QAction::setEnabled);
    connect(this, &QUndoStack::undoTextChanged, action, [=](const QString &text) {
        QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, text);
    });
    connect(action, &QAction::triggered, this, &QUndoStack::undo);

    return action;
}